

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O3

__int128 * __thiscall
calculator::ExpressionParser<__int128>::parseExpr
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this)

{
  deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
  *this_00;
  int iVar1;
  long lVar2;
  undefined1 v1 [16];
  undefined1 v2 [16];
  __int128 *p_Var3;
  undefined8 *puVar4;
  ExpressionParser<__int128> *pEVar5;
  uint uVar6;
  Operator OVar7;
  Operator OVar8;
  undefined4 in_stack_ffffffffffffff98;
  _Alloc_hider _Var9;
  int iVar11;
  Operator OVar10;
  undefined4 in_stack_ffffffffffffffb4;
  
  this_00 = (deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
             *)((long)__return_storage_ptr__ + 0x28);
  pEVar5 = (ExpressionParser<__int128> *)&stack0xffffffffffffffa8;
  _Var9._M_p = (pointer)0x0;
  iVar11 = 0x4c;
  std::
  deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
  ::emplace_back<calculator::ExpressionParser<__int128>::OperatorValue>
            (this_00,(OperatorValue *)pEVar5);
  p_Var3 = parseValue(__return_storage_ptr__,pEVar5);
  OVar8.associativity = iVar11;
  OVar8._0_8_ = _Var9._M_p;
  if (*(long *)((long)__return_storage_ptr__ + 0x58) ==
      *(long *)((long)__return_storage_ptr__ + 0x38)) {
    return (__int128 *)0x0;
  }
LAB_00117c9b:
  OVar10 = OVar8;
  OVar7 = parseOp((ExpressionParser<__int128> *)__return_storage_ptr__);
  uVar6 = OVar7.associativity ^ 0x4c;
  OVar8 = OVar7;
  do {
    lVar2 = *(long *)((long)__return_storage_ptr__ + 0x58);
    iVar11 = OVar7.precedence;
    if (lVar2 == (long)__return_storage_ptr__[6]) {
      iVar1 = *(int *)(*(long *)((long)__return_storage_ptr__[7] + -8) + 0x1e4);
      if ((iVar1 <= iVar11) && (iVar1 != iVar11 || uVar6 != 0)) break;
      lVar2 = *(long *)((long)__return_storage_ptr__[7] + -8);
      if (*(int *)(lVar2 + 0x1e0) == 0) goto LAB_00117dac;
      puVar4 = (undefined8 *)(lVar2 + 0x1f0);
    }
    else {
      if ((*(int *)(lVar2 + -0x1c) <= iVar11) && (*(int *)(lVar2 + -0x1c) != iVar11 || uVar6 != 0))
      break;
      if (*(int *)(lVar2 + -0x20) == 0) {
LAB_00117dac:
        std::
        deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
        ::pop_back(this_00);
        return p_Var3;
      }
      puVar4 = (undefined8 *)(lVar2 + -0x10);
    }
    v1._4_4_ = OVar8.associativity;
    v1._0_4_ = in_stack_ffffffffffffff98;
    v1._8_8_ = OVar8._0_8_;
    v2._12_4_ = in_stack_ffffffffffffffb4;
    v2._0_4_ = OVar10.op;
    v2._4_4_ = OVar10.precedence;
    v2._8_4_ = OVar10.associativity;
    p_Var3 = calculate(__return_storage_ptr__,(ExpressionParser<__int128> *)*puVar4,(__int128)v1,
                       (__int128)v2,(Operator *)puVar4[1]);
    std::
    deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
    ::pop_back(this_00);
  } while( true );
  pEVar5 = (ExpressionParser<__int128> *)&stack0xffffffffffffffa8;
  std::
  deque<calculator::ExpressionParser<__int128>::OperatorValue,_std::allocator<calculator::ExpressionParser<__int128>::OperatorValue>_>
  ::emplace_back<calculator::ExpressionParser<__int128>::OperatorValue>
            (this_00,(OperatorValue *)pEVar5);
  p_Var3 = parseValue(__return_storage_ptr__,pEVar5);
  if (*(long *)((long)__return_storage_ptr__ + 0x58) ==
      *(long *)((long)__return_storage_ptr__ + 0x38)) {
    return (__int128 *)0x0;
  }
  goto LAB_00117c9b;
}

Assistant:

T parseExpr()
  {
    stack_.push(OperatorValue(Operator(OPERATOR_NULL, 0, 'L'), 0));
    // first parse value on the left
    T value = parseValue();

    while (!stack_.empty())
    {
      // parse an operator (+, -, *, ...)
      Operator op(parseOp());
      while (op.precedence  < stack_.top().getPrecedence() || (
             op.precedence == stack_.top().getPrecedence() &&
             op.associativity == 'L'))
      {
        // end reached
        if (stack_.top().isNull())
        {
          stack_.pop();
          return value;
        }
        // do the calculation ("reduce"), producing a new value
        value = calculate(stack_.top().value, value, stack_.top().op);
        stack_.pop();
      }

      // store on stack_ and continue parsing ("shift")
      stack_.push(OperatorValue(op, value));
      // parse value on the right
      value = parseValue();
    }
    return 0;
  }